

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Time.cpp
# Opt level: O1

void __thiscall Time::Time(Time *this,bool utc)

{
  tm *ptVar1;
  undefined7 in_register_00000031;
  time_t now;
  tm tmBuf;
  time_t local_50;
  tm local_48;
  
  this->utc = utc;
  ::time(&local_50);
  if ((int)CONCAT71(in_register_00000031,utc) == 0) {
    ptVar1 = localtime_r(&local_50,&local_48);
  }
  else {
    ptVar1 = gmtime_r(&local_50,&local_48);
  }
  this->sec = ptVar1->tm_sec;
  this->min = ptVar1->tm_min;
  this->hour = ptVar1->tm_hour;
  this->day = ptVar1->tm_mday;
  this->month = ptVar1->tm_mon + 1;
  this->year = ptVar1->tm_year + 0x76c;
  this->wday = ptVar1->tm_wday;
  this->yday = ptVar1->tm_yday;
  this->dst = ptVar1->tm_isdst != 0;
  return;
}

Assistant:

Time::Time(bool utc) : utc(utc)
{
  time_t now;
  ::time(&now);
#ifdef _WIN32
  tm* tm = utc ? ::gmtime(&now) : ::localtime(&now); // win32 gmtime and localtime are thread save
#else
  struct tm tmBuf;
  tm* tm = utc ? ::gmtime_r(&now, &tmBuf) : ::localtime_r(&now, &tmBuf);
#endif
  sec = tm->tm_sec;
  min = tm->tm_min;
  hour = tm->tm_hour;
  day = tm->tm_mday;
  month = tm->tm_mon + 1;
  year = tm->tm_year + 1900;
  wday = tm->tm_wday;
  yday = tm->tm_yday;
  dst = !!tm->tm_isdst;
}